

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool CoreML::Specification::SamePadding_SamePaddingMode_IsValid(int value)

{
  return (uint)value < 2;
}

Assistant:

bool SamePadding_SamePaddingMode_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}